

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hop.h
# Opt level: O0

Hop_Obj_t * Hop_ManFetchMemory(Hop_Man_t *p)

{
  int iVar1;
  Hop_Obj_t *__s;
  int iVar2;
  Hop_Obj_t *pTemp;
  Hop_Man_t *p_local;
  
  if (p->pListFree == (Hop_Obj_t *)0x0) {
    Hop_ManAddMemory(p);
  }
  __s = p->pListFree;
  p->pListFree = (Hop_Obj_t *)__s->field_0;
  memset(__s,0,0x28);
  if (p->vObjs != (Vec_Ptr_t *)0x0) {
    iVar1 = p->nCreated;
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar1 != iVar2) {
      __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hop.h"
                    ,0xf0,"Hop_Obj_t *Hop_ManFetchMemory(Hop_Man_t *)");
    }
    Vec_PtrPush(p->vObjs,__s);
  }
  iVar1 = p->nCreated;
  p->nCreated = iVar1 + 1;
  __s->Id = iVar1;
  return __s;
}

Assistant:

static inline Hop_Obj_t * Hop_ManFetchMemory( Hop_Man_t * p )  
{ 
    Hop_Obj_t * pTemp;
    if ( p->pListFree == NULL )
        Hop_ManAddMemory( p );
    pTemp = p->pListFree;
    p->pListFree = *((Hop_Obj_t **)pTemp);
    memset( pTemp, 0, sizeof(Hop_Obj_t) ); 
    if ( p->vObjs )
    {
        assert( p->nCreated == Vec_PtrSize(p->vObjs) );
        Vec_PtrPush( p->vObjs, pTemp );
    }
    pTemp->Id = p->nCreated++;
    return pTemp;
}